

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::read_image_header(CVmImageLoader *this)

{
  int iVar1;
  undefined8 *in_RDI;
  char buf [128];
  undefined1 local_88 [11];
  undefined1 auStack_7d [34];
  undefined8 local_5b;
  undefined8 local_53;
  undefined8 local_4b;
  
  (**(code **)(*(long *)*in_RDI + 0x18))((long *)*in_RDI,local_88,0x45);
  iVar1 = memcmp(local_88,"T3-image\r\n\x1a",0xb);
  if (iVar1 != 0) {
    err_throw(0);
  }
  iVar1 = ::osrp2(auStack_7d);
  *(int *)(in_RDI + 4) = iVar1;
  *(undefined8 *)((long)in_RDI + 0x24) = local_5b;
  *(undefined8 *)((long)in_RDI + 0x2c) = local_53;
  *(undefined8 *)((long)in_RDI + 0x34) = local_4b;
  if (1 < *(uint *)(in_RDI + 4)) {
    err_throw_a(0x13f,1,8);
  }
  return;
}

Assistant:

void CVmImageLoader::read_image_header()
{
    char buf[128];

    /* 
     *   Read the header.  The header consists of the signature string, a
     *   UINT2 with the file format version number, 32 reserved bytes,
     *   then the compilation timestamp (24 bytes).  
     */
    fp_->copy_data(buf, sizeof(VMIMAGE_SIG)-1 + 2 + 32 + 24);

    /* verify the signature */
    if (memcmp(buf, VMIMAGE_SIG, sizeof(VMIMAGE_SIG)-1) != 0)
        err_throw(VMERR_NOT_AN_IMAGE_FILE);

    /* get the version number */
    ver_ = osrp2(buf + sizeof(VMIMAGE_SIG)-1);

    /* store the timestamp */
    memcpy(timestamp_, buf + sizeof(VMIMAGE_SIG)-1 + 2 + 32, 24);

    /* 
     *   Check the version to ensure that it's within the range that this
     *   loader implementation supports.  If not, throw an error, and mark is
     *   as a version-related error.  
     */
    if (ver_ > 1)
        err_throw_a(VMERR_IMAGE_INCOMPAT_VSN, 1, ERR_TYPE_VERSION_FLAG);
}